

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void bifftell(bifcxdef *ctx,int argc)

{
  FILE *__stream;
  undefined4 in_ESI;
  osfildef *fp;
  int *in_stack_ffffffffffffffe0;
  int *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  __stream = (FILE *)bif_get_file((bifcxdef *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                                  in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  ftell(__stream);
  runpnum((runcxdef *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(long)__stream);
  return;
}

Assistant:

void bifftell(bifcxdef *ctx, int argc)
{
    osfildef *fp;

    /* get the file number */
    bifcntargs(ctx, 1, argc);
    fp = bif_get_file(ctx, (int *)0, 0);

    /* return the seek position */
    runpnum(ctx->bifcxrun, osfpos(fp));
}